

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_header_cbr(pt_event_decoder *decoder,pt_packet_cbr *packet)

{
  pt_config *config;
  pt_event *ppVar1;
  int errcode;
  pt_event *ev;
  pt_packet_cbr *packet_local;
  pt_event_decoder *decoder_local;
  
  if (decoder == (pt_event_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    config = pt_evt_config(decoder);
    decoder_local._4_4_ = pt_evt_apply_header_cbr(&decoder->time,&decoder->tcal,packet,config);
    if (-1 < decoder_local._4_4_) {
      ppVar1 = pt_evq_enqueue(&decoder->evq,1);
      if (ppVar1 == (pt_event *)0x0) {
        decoder_local._4_4_ = -9;
      }
      else {
        ppVar1->field_0x4 = ppVar1->field_0x4 & 0xfd | 2;
        ppVar1->type = ptev_cbr;
        *(ushort *)&ppVar1->variant = (ushort)packet->ratio;
        decoder_local._4_4_ = 0;
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_header_cbr(struct pt_event_decoder *decoder,
			     const struct pt_packet_cbr *packet)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	errcode = pt_evt_apply_header_cbr(&decoder->time, &decoder->tcal,
					  packet, pt_evt_config(decoder));
	if (errcode < 0)
		return errcode;

	ev = pt_evq_enqueue(&decoder->evq, evb_psbend);
	if (!ev)
		return -pte_nomem;

	ev->status_update = 1;
	ev->type = ptev_cbr;
	ev->variant.cbr.ratio = packet->ratio;

	return 0;
}